

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob.cpp
# Opt level: O2

string * __thiscall
duckdb::Blob::FromBase64_abi_cxx11_(string *__return_storage_ptr__,Blob *this,string_t blob)

{
  data_ptr_t output;
  tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_> __s;
  idx_t in_R8;
  string_t str;
  string_t str_00;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_true> data;
  __uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> local_30;
  
  str.value._8_8_ = blob.value._0_8_;
  str.value._0_8_ = str.value._8_8_;
  output = (data_ptr_t)FromBase64Size(this,str);
  __s.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>)
       operator_new__((ulong)output);
  switchD_014c3389::default
            ((void *)__s.
                     super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                     super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0,(size_t)output);
  str_00.value.pointer.ptr =
       (char *)__s.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
               super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  str_00.value._0_8_ = str.value._8_8_;
  local_30._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_>)
       (tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_>)
       __s.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  FromBase64(this,str_00,output,in_R8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             __s.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
             super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,
             output + (long)__s.
                            super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                            .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
  ::std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

string Blob::FromBase64(string_t blob) {
	auto decoded_size = Blob::FromBase64Size(blob);
	auto data = make_uniq_array<data_t>(decoded_size);
	Blob::FromBase64(blob, data.get(), decoded_size);
	return string(char_ptr_cast(data.get()), decoded_size);
}